

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O3

void C_RemoveTabCommand(char *name)

{
  TabData *pTVar1;
  TabData *pTVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  iVar4 = FName::NameManager::FindName(&FName::NameData,name,true);
  uVar3 = TabCommands.Count;
  pTVar2 = TabCommands.Array;
  if ((iVar4 != 0) && ((ulong)TabCommands.Count != 0)) {
    uVar5 = 0;
    do {
      if (TabCommands.Array[uVar5].TabName.Index == iVar4) {
        pTVar1 = TabCommands.Array + uVar5;
        pTVar1->UseCount = pTVar1->UseCount + -1;
        if (pTVar1->UseCount != 0) {
          return;
        }
        TabCommands.Count = uVar3 - 1;
        if (TabCommands.Count <= (uint)uVar5) {
          return;
        }
        memmove(pTVar2 + uVar5,pTVar2 + uVar5 + 1,(ulong)(TabCommands.Count - (uint)uVar5) << 3);
        return;
      }
      uVar5 = uVar5 + 1;
    } while (TabCommands.Count != uVar5);
  }
  return;
}

Assistant:

void C_RemoveTabCommand (const char *name)
{
	FName aname(name, true);

	if (aname == NAME_None)
	{
		return;
	}
	for (unsigned int i = 0; i < TabCommands.Size(); ++i)
	{
		if (TabCommands[i].TabName == aname)
		{
			if (--TabCommands[i].UseCount == 0)
			{
				TabCommands.Delete(i);
			}
			break;
		}
	}
}